

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O0

void cave_illuminate(chunk *c,_Bool daytime)

{
  bool bVar1;
  _Bool _Var2;
  loc_conflict lVar3;
  loc_conflict lVar4;
  square_conflict *psVar5;
  loc a_grid_1;
  loc grid_1;
  loc a_grid;
  loc grid;
  int iStack_20;
  _Bool light;
  wchar_t d;
  wchar_t i;
  wchar_t x;
  wchar_t y;
  _Bool daytime_local;
  chunk *c_local;
  
  for (i = L'\0'; i < c->height; i = i + L'\x01') {
    for (d = L'\0'; d < c->width; d = d + L'\x01') {
      bVar1 = false;
      lVar3 = (loc_conflict)loc(d,i);
      for (grid.y = 0; grid.y < 9; grid.y = grid.y + 1) {
        lVar4 = (loc_conflict)loc_sum((loc)lVar3,ddgrid_ddd[grid.y]);
        _Var2 = square_in_bounds_fully(c,lVar4);
        if ((_Var2) &&
           ((_Var2 = square_isfloor(c,lVar4), _Var2 || (_Var2 = square_isstairs(c,lVar4), _Var2))))
        {
          bVar1 = true;
        }
      }
      if ((daytime) || (_Var2 = square_isfloor(c,lVar3), !_Var2)) {
        psVar5 = square(c,lVar3);
        flag_on_dbg(psVar5->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
        if (bVar1) {
          square_memorize(c,lVar3);
        }
      }
      else {
        _Var2 = square_isbright(c,lVar3);
        if (!_Var2) {
          psVar5 = square(c,lVar3);
          flag_off(psVar5->info,3,2);
          _Var2 = square_isfloor(c,lVar3);
          if (_Var2) {
            square_forget(c,lVar3);
          }
        }
      }
    }
  }
  for (i = L'\0'; i < c->height; i = i + L'\x01') {
    for (d = L'\0'; d < c->width; d = d + L'\x01') {
      lVar3 = (loc_conflict)loc(d,i);
      _Var2 = square_isshop(c,lVar3);
      if (_Var2) {
        for (iStack_20 = 0; iStack_20 < 8; iStack_20 = iStack_20 + 1) {
          lVar4 = (loc_conflict)loc_sum((loc)lVar3,ddgrid_ddd[iStack_20]);
          psVar5 = square(c,lVar4);
          flag_on_dbg(psVar5->info,3,2,"square(c, a_grid)->info","SQUARE_GLOW");
          square_memorize(c,lVar4);
        }
      }
    }
  }
  player->upkeep->update = player->upkeep->update | 0x60;
  player->upkeep->redraw = player->upkeep->redraw | 0xc10000;
  return;
}

Assistant:

void cave_illuminate(struct chunk *c, bool daytime)
{
	int y, x, i;

	/* Apply light or darkness */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			int d;
			bool light = false;
			struct loc grid = loc(x, y);
			
			/* Skip grids with no surrounding floors or stairs */
			for (d = 0; d < 9; d++) {
				/* Extract adjacent (legal) location */
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Paranoia */
				if (!square_in_bounds_fully(c, a_grid)) continue;

				/* Test */
				if (square_isfloor(c, a_grid) || square_isstairs(c, a_grid))
					light = true;
			}

			/* Only interesting grids at night */
			if (daytime || !square_isfloor(c, grid)) {
				sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
				if(light) square_memorize(c, grid);
			} else if (!square_isbright(c, grid)) {
				sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
				/* Hack -- like cave_unlight(), forget "boring" grids */
				if (square_isfloor(c, grid))
					square_forget(c, grid);
			}
		}
	}
			
			
	/* Light shop doorways */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			if (!square_isshop(c, grid))
				continue;
			for (i = 0; i < 8; i++) {
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);
				sqinfo_on(square(c, a_grid)->info, SQUARE_GLOW);
				square_memorize(c, a_grid);
			}
		}
	}


	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}